

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::MetatraceWriter::~MetatraceWriter(MetatraceWriter *this)

{
  MetatraceWriter *this_local;
  
  Disable(this);
  perfetto::base::WeakPtrFactory<perfetto::MetatraceWriter>::~WeakPtrFactory
            (&this->weak_ptr_factory_);
  std::unique_ptr<perfetto::TraceWriter,_std::default_delete<perfetto::TraceWriter>_>::~unique_ptr
            (&this->trace_writer_);
  return;
}

Assistant:

MetatraceWriter::~MetatraceWriter() {
  Disable();
}